

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O2

bool __thiscall miniply::PLYReader::which_property_type(PLYReader *this,PLYPropertyType *type)

{
  char *kw;
  long lVar1;
  bool bVar2;
  long lVar3;
  
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    kw = *(char **)((long)&kTypeAliases + lVar3);
    if ((int)(lVar3 + 0x10) == 0x110) goto LAB_00104a56;
    bVar2 = keyword(this,kw);
    lVar1 = lVar3 + 0x10;
  } while (!bVar2);
  *type = *(PLYPropertyType *)((long)&DAT_0010cc78 + lVar3);
LAB_00104a56:
  return kw != (char *)0x0;
}

Assistant:

bool PLYReader::which_property_type(PLYPropertyType* type)
  {
    for (uint32_t i = 0; kTypeAliases[i].name != nullptr; i++) {
      if (keyword(kTypeAliases[i].name)) {
        *type = kTypeAliases[i].type;
        return true;
      }
    }
    return false;
  }